

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O0

mallinfo2 * tc_mallinfo2(void)

{
  mallinfo2 *in_RDI;
  
  anon_unknown.dwarf_104c2::do_mallinfo<mallinfo2>();
  return in_RDI;
}

Assistant:

PERFTOOLS_DLL_DECL struct mallinfo2 tc_mallinfo2(void) PERFTOOLS_NOTHROW {
  return do_mallinfo<struct mallinfo2>();
}